

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-iter.c
# Opt level: O0

void test_bson_iter_binary_deprecated(void)

{
  byte bVar1;
  bson_t *pbVar2;
  bson_t *b;
  bson_iter_t iter;
  uint8_t *binary;
  uint32_t binary_len;
  bson_subtype_t subtype;
  undefined1 local_100 [96];
  int *local_a0;
  int local_98;
  undefined1 local_94 [140];
  
  pbVar2 = get_bson(
                   "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson//tests/binary/binary_deprecated.bson"
                   );
  if (pbVar2 == (bson_t *)0x0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-iter.c",
            0xa5,"test_bson_iter_binary_deprecated","b");
    abort();
  }
  bVar1 = bson_iter_init(local_100,pbVar2);
  if ((bVar1 & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-iter.c",
            0xa7,"test_bson_iter_binary_deprecated","bson_iter_init (&iter, b)");
    abort();
  }
  bVar1 = bson_iter_next(local_100);
  if ((bVar1 & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-iter.c",
            0xa8,"test_bson_iter_binary_deprecated","bson_iter_next (&iter)");
    abort();
  }
  bson_iter_binary(local_100,local_94,&local_98,&local_a0);
  if (local_98 != 4) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-iter.c",
            0xaa,"test_bson_iter_binary_deprecated","binary_len == 4");
    abort();
  }
  if (*local_a0 != 0x34333231) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-iter.c",
            0xab,"test_bson_iter_binary_deprecated","memcmp (binary, \"1234\", 4) == 0");
    abort();
  }
  bson_destroy(pbVar2);
  return;
}

Assistant:

static void
test_bson_iter_binary_deprecated (void)
{
   bson_subtype_t subtype;
   uint32_t binary_len;
   const uint8_t *binary;
   bson_iter_t iter;
   bson_t *b;

   b = get_bson (BINARY_DIR "/binary_deprecated.bson");
   BSON_ASSERT (b);

   BSON_ASSERT (bson_iter_init (&iter, b));
   BSON_ASSERT (bson_iter_next (&iter));
   bson_iter_binary (&iter, &subtype, &binary_len, &binary);
   BSON_ASSERT (binary_len == 4);
   BSON_ASSERT (memcmp (binary, "1234", 4) == 0);

   bson_destroy (b);
}